

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O3

clock_t __thiscall SID::clock(SID *this)

{
  sampling_method sVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar3;
  uint in_ECX;
  ulong uVar4;
  short *in_RDX;
  short sVar5;
  cycle_count *in_RSI;
  int in_R8D;
  ulong uVar6;
  uint uVar7;
  
  sVar1 = this->sampling;
  if (sVar1 == SAMPLE_INTERPOLATE) {
    iVar2 = clock_interpolate(this,in_RSI,in_RDX,in_ECX,in_R8D);
    return CONCAT44(extraout_var_01,iVar2);
  }
  if (sVar1 != SAMPLE_RESAMPLE_INTERPOLATE) {
    if (sVar1 == SAMPLE_RESAMPLE_FAST) {
      iVar2 = clock_resample_fast(this,in_RSI,in_RDX,in_ECX,in_R8D);
      return CONCAT44(extraout_var,iVar2);
    }
    uVar7 = this->sample_offset + this->cycles_per_sample + 0x8000;
    iVar2 = (int)uVar7 >> 0x10;
    uVar6 = 0;
    if (iVar2 <= *in_RSI) {
      uVar6 = 0;
      uVar4 = (ulong)in_ECX;
      if ((int)in_ECX < 1) {
        uVar4 = uVar6;
      }
      do {
        if (uVar4 == uVar6) {
          return uVar4;
        }
        clock(this);
        *in_RSI = *in_RSI - iVar2;
        this->sample_offset = (uVar7 & 0xffff) - 0x8000;
        iVar2 = (this->extfilt).Vo;
        lVar3 = (long)iVar2;
        sVar5 = (short)(uint)((ulong)(lVar3 * 0x2e8ba2e9) >> 0x21) - (short)(iVar2 >> 0x1f);
        if (lVar3 < -0x5800a) {
          sVar5 = -0x8000;
        }
        if (0x57fff < lVar3) {
          sVar5 = 0x7fff;
        }
        uVar6 = uVar6 + 1;
        *in_RDX = sVar5;
        uVar7 = (uVar7 & 0xffff) + this->cycles_per_sample;
        iVar2 = (int)uVar7 >> 0x10;
        in_RDX = in_RDX + in_R8D;
      } while (iVar2 <= *in_RSI);
    }
    clock(this);
    this->sample_offset = this->sample_offset + *in_RSI * -0x10000;
    *in_RSI = 0;
    return uVar6 & 0xffffffff;
  }
  iVar2 = clock_resample_interpolate(this,in_RSI,in_RDX,in_ECX,in_R8D);
  return CONCAT44(extraout_var_00,iVar2);
}

Assistant:

int SID::clock(cycle_count& delta_t, short* buf, int n, int interleave)
{
  switch (sampling) {
  default:
  case SAMPLE_FAST:
    return clock_fast(delta_t, buf, n, interleave);
  case SAMPLE_INTERPOLATE:
    return clock_interpolate(delta_t, buf, n, interleave);
  case SAMPLE_RESAMPLE_INTERPOLATE:
    return clock_resample_interpolate(delta_t, buf, n, interleave);
  case SAMPLE_RESAMPLE_FAST:
    return clock_resample_fast(delta_t, buf, n, interleave);
  }
}